

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  secp256k1_rfc6979_hmac_sha256 *in_RCX;
  uchar *in_R8;
  uint in_R9D;
  uint i;
  secp256k1_rfc6979_hmac_sha256 rng;
  uint offset;
  uchar keydata [112];
  secp256k1_rfc6979_hmac_sha256 *in_stack_000000c0;
  uint in_stack_ffffffffffffff0c;
  uint uVar1;
  void *in_stack_ffffffffffffff10;
  uint *in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  undefined1 local_a8 [120];
  undefined4 in_stack_ffffffffffffffd0;
  
  buffer_append(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                in_stack_ffffffffffffff0c);
  buffer_append(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                in_stack_ffffffffffffff0c);
  if (in_R8 != (uchar *)0x0) {
    buffer_append(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff0c);
  }
  if (in_RCX != (secp256k1_rfc6979_hmac_sha256 *)0x0) {
    buffer_append(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff0c);
  }
  secp256k1_rfc6979_hmac_sha256_initialize(in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  memset(local_a8,0,0x70);
  for (uVar1 = 0; uVar1 <= in_R9D; uVar1 = uVar1 + 1) {
    secp256k1_rfc6979_hmac_sha256_generate
              (in_stack_000000c0,(uchar *)keydata._104_8_,keydata._96_8_);
  }
  secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)0x1058ae);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msg32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   memset(keydata, 0, sizeof(keydata));
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);
   return 1;
}